

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpuck.cc
# Opt level: O3

int test_extls(void)

{
  uint3 uVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  char *pcVar5;
  char *pcVar6;
  
  _plan(0xb1,true);
  _space((FILE *)_stdout);
  printf("# *** %s ***\n","test_extls");
  buf[1] = 0xd4;
  buf[2] = '\0';
  _space((FILE *)_stdout);
  fwrite("# ",2,1,_stdout);
  fwrite("extl 0x01U",10,1,_stdout);
  fputc(10,_stdout);
  if (mp_type_hint[(uint)(byte)buf[1]] == MP_EXT) {
    iVar2 = 1;
    if (((byte)buf[1] & 0xfffffff0) != 0xd0) {
      if (2 < (byte)(buf[1] + 0x39U)) goto LAB_0011c877;
      iVar2 = (1 << (buf[1] + 0x39U & 0x1f)) + 1;
    }
    _ok((uint)(iVar2 == 1),"mp_check_extl(data, d1) == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x1f0,"mp_check_extl(0x01U) == 0");
    switch(buf[1]) {
    case -0x39:
      uVar3 = (uint)(byte)buf[2];
      pcVar6 = buf + 3;
      break;
    case -0x38:
      uVar3 = (uint)(ushort)(CONCAT11(buf[3],buf[2]) << 8 | (ushort)(byte)buf[3]);
      pcVar6 = buf + 4;
      break;
    case -0x37:
      uVar1 = CONCAT12(buf[4],CONCAT11(buf[3],buf[2]));
      uVar3 = (uint)(byte)buf[5] | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 |
              CONCAT13(buf[5],uVar1) << 0x18;
      pcVar6 = buf + 6;
      break;
    default:
      goto switchD_00118840_caseD_ca;
    case -0x2c:
    case -0x2b:
    case -0x2a:
    case -0x29:
    case -0x28:
      uVar3 = 1 << (buf[1] + 0x2cU & 0x1f);
      pcVar6 = buf + 2;
    }
    _ok((uint)(uVar3 == 1),"mp_decode_extl(&d2 SCALAR(COMMA &ext_type)) == (0x01U)",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x1f0,"mp_decode(mp_encode(0x01U)) == 0x01U");
    _ok(1,"(d1 - data) == (2)",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x1f0,"len(mp_encode_extl(0x01U)");
    _ok((uint)(pcVar6 == buf + 2),"d1 == d2",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x1f0,"len(mp_decode_extl(0x01U))");
    _ok(1,"mp_sizeof_extl(0x01U) == 2",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x1f0,"mp_sizeof_extl(0x01U)");
    _ok((uint)(CONCAT11(buf[2],buf[1]) == 0xd4),"memcmp(data, (\"\\xd4\\x00\"), (2)) == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x1f0,"mp_encode(0x01U) == \"\\xd4\\x00\"");
    buf[1] = 0xd5;
    buf[2] = '\0';
    _space((FILE *)_stdout);
    fwrite("# ",2,1,_stdout);
    fwrite("extl 0x02U",10,1,_stdout);
    fputc(10,_stdout);
    if (mp_type_hint[(uint)(byte)buf[1]] != MP_EXT) goto LAB_0011c839;
    iVar2 = 1;
    if (((byte)buf[1] & 0xfffffff0) != 0xd0) {
      if (2 < (byte)(buf[1] + 0x39U)) goto LAB_0011c877;
      iVar2 = (1 << (buf[1] + 0x39U & 0x1f)) + 1;
    }
    _ok((uint)(iVar2 == 1),"mp_check_extl(data, d1) == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x1f1,"mp_check_extl(0x02U) == 0");
    switch(buf[1]) {
    case -0x39:
      uVar3 = (uint)(byte)buf[2];
      pcVar6 = buf + 3;
      break;
    case -0x38:
      uVar3 = (uint)(ushort)(CONCAT11(buf[3],buf[2]) << 8 | (ushort)(byte)buf[3]);
      pcVar6 = buf + 4;
      break;
    case -0x37:
      uVar1 = CONCAT12(buf[4],CONCAT11(buf[3],buf[2]));
      uVar3 = (uint)(byte)buf[5] | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 |
              CONCAT13(buf[5],uVar1) << 0x18;
      pcVar6 = buf + 6;
      break;
    default:
      goto switchD_00118840_caseD_ca;
    case -0x2c:
    case -0x2b:
    case -0x2a:
    case -0x29:
    case -0x28:
      uVar3 = 1 << (buf[1] + 0x2cU & 0x1f);
      pcVar6 = buf + 2;
    }
    _ok((uint)(uVar3 == 2),"mp_decode_extl(&d2 SCALAR(COMMA &ext_type)) == (0x02U)",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x1f1,"mp_decode(mp_encode(0x02U)) == 0x02U");
    _ok(1,"(d1 - data) == (2)",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x1f1,"len(mp_encode_extl(0x02U)");
    _ok((uint)(pcVar6 == buf + 2),"d1 == d2",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x1f1,"len(mp_decode_extl(0x02U))");
    _ok(1,"mp_sizeof_extl(0x02U) == 2",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x1f1,"mp_sizeof_extl(0x02U)");
    _ok((uint)(CONCAT11(buf[2],buf[1]) == 0xd5),"memcmp(data, (\"\\xd5\\x00\"), (2)) == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x1f1,"mp_encode(0x02U) == \"\\xd5\\x00\"");
    buf[1] = 0xd6;
    buf[2] = '\0';
    _space((FILE *)_stdout);
    fwrite("# ",2,1,_stdout);
    fwrite("extl 0x04U",10,1,_stdout);
    fputc(10,_stdout);
    if (mp_type_hint[(uint)(byte)buf[1]] != MP_EXT) goto LAB_0011c839;
    iVar2 = 1;
    if (((byte)buf[1] & 0xfffffff0) != 0xd0) {
      if (2 < (byte)(buf[1] + 0x39U)) goto LAB_0011c877;
      iVar2 = (1 << (buf[1] + 0x39U & 0x1f)) + 1;
    }
    _ok((uint)(iVar2 == 1),"mp_check_extl(data, d1) == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x1f2,"mp_check_extl(0x04U) == 0");
    switch(buf[1]) {
    case -0x39:
      uVar3 = (uint)(byte)buf[2];
      pcVar6 = buf + 3;
      break;
    case -0x38:
      uVar3 = (uint)(ushort)(CONCAT11(buf[3],buf[2]) << 8 | (ushort)(byte)buf[3]);
      pcVar6 = buf + 4;
      break;
    case -0x37:
      uVar1 = CONCAT12(buf[4],CONCAT11(buf[3],buf[2]));
      uVar3 = (uint)(byte)buf[5] | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 |
              CONCAT13(buf[5],uVar1) << 0x18;
      pcVar6 = buf + 6;
      break;
    default:
      goto switchD_00118840_caseD_ca;
    case -0x2c:
    case -0x2b:
    case -0x2a:
    case -0x29:
    case -0x28:
      uVar3 = 1 << (buf[1] + 0x2cU & 0x1f);
      pcVar6 = buf + 2;
    }
    _ok((uint)(uVar3 == 4),"mp_decode_extl(&d2 SCALAR(COMMA &ext_type)) == (0x04U)",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x1f2,"mp_decode(mp_encode(0x04U)) == 0x04U");
    _ok(1,"(d1 - data) == (2)",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x1f2,"len(mp_encode_extl(0x04U)");
    _ok((uint)(pcVar6 == buf + 2),"d1 == d2",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x1f2,"len(mp_decode_extl(0x04U))");
    _ok(1,"mp_sizeof_extl(0x04U) == 2",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x1f2,"mp_sizeof_extl(0x04U)");
    _ok((uint)(CONCAT11(buf[2],buf[1]) == 0xd6),"memcmp(data, (\"\\xd6\\x00\"), (2)) == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x1f2,"mp_encode(0x04U) == \"\\xd6\\x00\"");
    buf[1] = 0xd7;
    buf[2] = '\0';
    _space((FILE *)_stdout);
    fwrite("# ",2,1,_stdout);
    fwrite("extl 0x08U",10,1,_stdout);
    fputc(10,_stdout);
    if (mp_type_hint[(uint)(byte)buf[1]] != MP_EXT) goto LAB_0011c839;
    iVar2 = 1;
    if (((byte)buf[1] & 0xfffffff0) != 0xd0) {
      if (2 < (byte)(buf[1] + 0x39U)) goto LAB_0011c877;
      iVar2 = (1 << (buf[1] + 0x39U & 0x1f)) + 1;
    }
    _ok((uint)(iVar2 == 1),"mp_check_extl(data, d1) == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",499,
        "mp_check_extl(0x08U) == 0");
    switch(buf[1]) {
    case -0x39:
      uVar3 = (uint)(byte)buf[2];
      pcVar6 = buf + 3;
      break;
    case -0x38:
      uVar3 = (uint)(ushort)(CONCAT11(buf[3],buf[2]) << 8 | (ushort)(byte)buf[3]);
      pcVar6 = buf + 4;
      break;
    case -0x37:
      uVar1 = CONCAT12(buf[4],CONCAT11(buf[3],buf[2]));
      uVar3 = (uint)(byte)buf[5] | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 |
              CONCAT13(buf[5],uVar1) << 0x18;
      pcVar6 = buf + 6;
      break;
    default:
      goto switchD_00118840_caseD_ca;
    case -0x2c:
    case -0x2b:
    case -0x2a:
    case -0x29:
    case -0x28:
      uVar3 = 1 << (buf[1] + 0x2cU & 0x1f);
      pcVar6 = buf + 2;
    }
    _ok((uint)(uVar3 == 8),"mp_decode_extl(&d2 SCALAR(COMMA &ext_type)) == (0x08U)",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",499,
        "mp_decode(mp_encode(0x08U)) == 0x08U");
    _ok(1,"(d1 - data) == (2)",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",499,
        "len(mp_encode_extl(0x08U)");
    _ok((uint)(pcVar6 == buf + 2),"d1 == d2",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",499,
        "len(mp_decode_extl(0x08U))");
    _ok(1,"mp_sizeof_extl(0x08U) == 2",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",499,
        "mp_sizeof_extl(0x08U)");
    _ok((uint)(CONCAT11(buf[2],buf[1]) == 0xd7),"memcmp(data, (\"\\xd7\\x00\"), (2)) == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",499,
        "mp_encode(0x08U) == \"\\xd7\\x00\"");
    buf[1] = 0xd8;
    buf[2] = '\0';
    _space((FILE *)_stdout);
    fwrite("# ",2,1,_stdout);
    fwrite("extl 0x10U",10,1,_stdout);
    fputc(10,_stdout);
    if (mp_type_hint[(uint)(byte)buf[1]] != MP_EXT) goto LAB_0011c839;
    iVar2 = 1;
    if (((byte)buf[1] & 0xfffffff0) != 0xd0) {
      if (2 < (byte)(buf[1] + 0x39U)) goto LAB_0011c877;
      iVar2 = (1 << (buf[1] + 0x39U & 0x1f)) + 1;
    }
    _ok((uint)(iVar2 == 1),"mp_check_extl(data, d1) == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",500,
        "mp_check_extl(0x10U) == 0");
    switch(buf[1]) {
    case -0x39:
      uVar3 = (uint)(byte)buf[2];
      pcVar6 = buf + 3;
      break;
    case -0x38:
      uVar3 = (uint)(ushort)(CONCAT11(buf[3],buf[2]) << 8 | (ushort)(byte)buf[3]);
      pcVar6 = buf + 4;
      break;
    case -0x37:
      uVar1 = CONCAT12(buf[4],CONCAT11(buf[3],buf[2]));
      uVar3 = (uint)(byte)buf[5] | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 |
              CONCAT13(buf[5],uVar1) << 0x18;
      pcVar6 = buf + 6;
      break;
    default:
      goto switchD_00118840_caseD_ca;
    case -0x2c:
    case -0x2b:
    case -0x2a:
    case -0x29:
    case -0x28:
      uVar3 = 1 << (buf[1] + 0x2cU & 0x1f);
      pcVar6 = buf + 2;
    }
    uVar4 = 0;
    _ok((uint)(uVar3 == 0x10),"mp_decode_extl(&d2 SCALAR(COMMA &ext_type)) == (0x10U)",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",500,
        "mp_decode(mp_encode(0x10U)) == 0x10U");
    _ok(1,"(d1 - data) == (2)",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",500,
        "len(mp_encode_extl(0x10U)");
    _ok((uint)(pcVar6 == buf + 2),"d1 == d2",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",500,
        "len(mp_decode_extl(0x10U))");
    _ok(1,"mp_sizeof_extl(0x10U) == 2",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",500,
        "mp_sizeof_extl(0x10U)");
    _ok((uint)(CONCAT11(buf[2],buf[1]) == 0xd8),"memcmp(data, (\"\\xd8\\x00\"), (2)) == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",500,
        "mp_encode(0x10U) == \"\\xd8\\x00\"");
    buf[1] = -0x39;
    buf[2] = '\x11';
    buf[3] = '\0';
    _space((FILE *)_stdout);
    fwrite("# ",2,1,_stdout);
    fwrite("extl 0x11U",10,1,_stdout);
    fputc(10,_stdout);
    if (mp_type_hint[(byte)buf[1]] != MP_EXT) goto LAB_0011c839;
    if ((buf[1] & 0xf0U) != 0xd0) {
      if (2 < (byte)(buf[1] + 0x39U)) goto LAB_0011c877;
      uVar4 = (uint)(buf[1] == -0x39);
    }
    _ok(uVar4,"mp_check_extl(data, d1) == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x1f7,"mp_check_extl(0x11U) == 0");
    switch(buf[1]) {
    case -0x39:
      uVar3 = (uint)(byte)buf[2];
      pcVar6 = buf + 3;
      break;
    case -0x38:
      uVar3 = (uint)(ushort)(CONCAT11(buf[3],buf[2]) << 8 | (ushort)(byte)buf[3]);
      pcVar6 = buf + 4;
      break;
    case -0x37:
      uVar1 = CONCAT12(buf[4],CONCAT11(buf[3],buf[2]));
      uVar3 = (uint)(byte)buf[5] | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 |
              CONCAT13(buf[5],uVar1) << 0x18;
      pcVar6 = buf + 6;
      break;
    default:
      goto switchD_00118840_caseD_ca;
    case -0x2c:
    case -0x2b:
    case -0x2a:
    case -0x29:
    case -0x28:
      uVar3 = 1 << (buf[1] + 0x2cU & 0x1f);
      pcVar6 = buf + 2;
    }
    uVar4 = 0;
    _ok((uint)(uVar3 == 0x11),"mp_decode_extl(&d2 SCALAR(COMMA &ext_type)) == (0x11U)",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x1f7,"mp_decode(mp_encode(0x11U)) == 0x11U");
    _ok(1,"(d1 - data) == (3)",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x1f7,"len(mp_encode_extl(0x11U)");
    pcVar5 = buf + 4;
    _ok((uint)(pcVar6 == buf + 3),"d1 == d2",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x1f7,"len(mp_decode_extl(0x11U))");
    _ok(1,"mp_sizeof_extl(0x11U) == 3",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x1f7,"mp_sizeof_extl(0x11U)");
    _ok((uint)(buf[3] == '\0' && CONCAT11(buf[2],buf[1]) == 0x11c7),
        "memcmp(data, (\"\\xc7\\x11\\x00\"), (3)) == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x1f7,"mp_encode(0x11U) == \"\\xc7\\x11\\x00\"");
    buf[1] = -0x39;
    buf[2] = -2;
    buf[3] = '\0';
    _space((FILE *)_stdout);
    fwrite("# ",2,1,_stdout);
    fwrite("extl 0xfeU",10,1,_stdout);
    fputc(10,_stdout);
    if (mp_type_hint[(byte)buf[1]] != MP_EXT) goto LAB_0011c839;
    if ((buf[1] & 0xf0U) != 0xd0) {
      if (2 < (byte)(buf[1] + 0x39U)) goto LAB_0011c877;
      uVar4 = (uint)(buf[1] == -0x39);
    }
    _ok(uVar4,"mp_check_extl(data, d1) == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x1f8,"mp_check_extl(0xfeU) == 0");
    switch(buf[1]) {
    case -0x39:
      uVar3 = (uint)(byte)buf[2];
      pcVar5 = buf + 3;
      break;
    case -0x38:
      uVar3 = (uint)(ushort)(CONCAT11(buf[3],buf[2]) << 8 | (ushort)(byte)buf[3]);
      break;
    case -0x37:
      uVar1 = CONCAT12(buf[4],CONCAT11(buf[3],buf[2]));
      uVar3 = (uint)(byte)buf[5] | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 |
              CONCAT13(buf[5],uVar1) << 0x18;
      pcVar5 = buf + 6;
      break;
    default:
      goto switchD_00118840_caseD_ca;
    case -0x2c:
    case -0x2b:
    case -0x2a:
    case -0x29:
    case -0x28:
      uVar3 = 1 << (buf[1] + 0x2cU & 0x1f);
      pcVar5 = buf + 2;
    }
    uVar4 = 0;
    _ok((uint)(uVar3 == 0xfe),"mp_decode_extl(&d2 SCALAR(COMMA &ext_type)) == (0xfeU)",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x1f8,"mp_decode(mp_encode(0xfeU)) == 0xfeU");
    _ok(1,"(d1 - data) == (3)",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x1f8,"len(mp_encode_extl(0xfeU)");
    _ok((uint)(pcVar5 == buf + 3),"d1 == d2",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x1f8,"len(mp_decode_extl(0xfeU))");
    _ok(1,"mp_sizeof_extl(0xfeU) == 3",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x1f8,"mp_sizeof_extl(0xfeU)");
    _ok((uint)(buf[3] == '\0' && CONCAT11(buf[2],buf[1]) == -0x139),
        "memcmp(data, (\"\\xc7\\xfe\\x00\"), (3)) == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x1f8,"mp_encode(0xfeU) == \"\\xc7\\xfe\\x00\"");
    buf[1] = -0x39;
    buf[2] = -1;
    buf[3] = '\0';
    _space((FILE *)_stdout);
    fwrite("# ",2,1,_stdout);
    fwrite("extl 0xffU",10,1,_stdout);
    fputc(10,_stdout);
    if (mp_type_hint[(byte)buf[1]] != MP_EXT) goto LAB_0011c839;
    if ((buf[1] & 0xf0U) != 0xd0) {
      if (2 < (byte)(buf[1] + 0x39U)) goto LAB_0011c877;
      uVar4 = (uint)(buf[1] == -0x39);
    }
    _ok(uVar4,"mp_check_extl(data, d1) == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x1f9,"mp_check_extl(0xffU) == 0");
    switch(buf[1]) {
    case -0x39:
      uVar3 = (uint)(byte)buf[2];
      pcVar6 = buf + 3;
      break;
    case -0x38:
      uVar3 = (uint)(ushort)(CONCAT11(buf[3],buf[2]) << 8 | (ushort)(byte)buf[3]);
      pcVar6 = buf + 4;
      break;
    case -0x37:
      uVar1 = CONCAT12(buf[4],CONCAT11(buf[3],buf[2]));
      uVar3 = (uint)(byte)buf[5] | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 |
              CONCAT13(buf[5],uVar1) << 0x18;
      pcVar6 = buf + 6;
      break;
    default:
      goto switchD_00118840_caseD_ca;
    case -0x2c:
    case -0x2b:
    case -0x2a:
    case -0x29:
    case -0x28:
      uVar3 = 1 << (buf[1] + 0x2cU & 0x1f);
      pcVar6 = buf + 2;
    }
    uVar4 = 0;
    _ok((uint)(uVar3 == 0xff),"mp_decode_extl(&d2 SCALAR(COMMA &ext_type)) == (0xffU)",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x1f9,"mp_decode(mp_encode(0xffU)) == 0xffU");
    _ok(1,"(d1 - data) == (3)",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x1f9,"len(mp_encode_extl(0xffU)");
    pcVar5 = buf + 4;
    _ok((uint)(pcVar6 == buf + 3),"d1 == d2",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x1f9,"len(mp_decode_extl(0xffU))");
    _ok(1,"mp_sizeof_extl(0xffU) == 3",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x1f9,"mp_sizeof_extl(0xffU)");
    _ok((uint)(buf[3] == '\0' && CONCAT11(buf[2],buf[1]) == -0x39),
        "memcmp(data, (\"\\xc7\\xff\\x00\"), (3)) == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x1f9,"mp_encode(0xffU) == \"\\xc7\\xff\\x00\"");
    buf[1] = -0x39;
    buf[2] = '\0';
    buf[3] = '\0';
    _space((FILE *)_stdout);
    fwrite("# ",2,1,_stdout);
    fwrite("extl 0x00U",10,1,_stdout);
    fputc(10,_stdout);
    if (mp_type_hint[(byte)buf[1]] != MP_EXT) goto LAB_0011c839;
    if ((buf[1] & 0xf0U) != 0xd0) {
      if (2 < (byte)(buf[1] + 0x39U)) goto LAB_0011c877;
      uVar4 = (uint)(buf[1] == -0x39);
    }
    _ok(uVar4,"mp_check_extl(data, d1) == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x1fb,"mp_check_extl(0x00U) == 0");
    switch(buf[1]) {
    case -0x39:
      uVar3 = (uint)(byte)buf[2];
      pcVar5 = buf + 3;
      break;
    case -0x38:
      uVar3 = (uint)(ushort)(CONCAT11(buf[3],buf[2]) << 8 | (ushort)(byte)buf[3]);
      break;
    case -0x37:
      uVar1 = CONCAT12(buf[4],CONCAT11(buf[3],buf[2]));
      uVar3 = (uint)(byte)buf[5] | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 |
              CONCAT13(buf[5],uVar1) << 0x18;
      pcVar5 = buf + 6;
      break;
    default:
      goto switchD_00118840_caseD_ca;
    case -0x2c:
    case -0x2b:
    case -0x2a:
    case -0x29:
    case -0x28:
      uVar3 = 1;
      pcVar5 = buf + 2;
    }
    _ok((uint)(uVar3 == 0),"mp_decode_extl(&d2 SCALAR(COMMA &ext_type)) == (0x00U)",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x1fb,"mp_decode(mp_encode(0x00U)) == 0x00U");
    _ok(1,"(d1 - data) == (3)",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x1fb,"len(mp_encode_extl(0x00U)");
    _ok((uint)(pcVar5 == buf + 3),"d1 == d2",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x1fb,"len(mp_decode_extl(0x00U))");
    _ok(1,"mp_sizeof_extl(0x00U) == 3",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x1fb,"mp_sizeof_extl(0x00U)");
    _ok((uint)(buf[3] == '\0' && CONCAT11(buf[2],buf[1]) == 199),
        "memcmp(data, (\"\\xc7\\x00\\x00\"), (3)) == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x1fb,"mp_encode(0x00U) == \"\\xc7\\x00\\x00\"");
    buf[2] = '\x03';
    buf[1] = -0x39;
    buf[3] = '\0';
    _space((FILE *)_stdout);
    fwrite("# ",2,1,_stdout);
    fwrite("extl 0x03U",10,1,_stdout);
    fputc(10,_stdout);
    if (mp_type_hint[(uint)(byte)buf[1]] != MP_EXT) goto LAB_0011c839;
    iVar2 = 1;
    if (((byte)buf[1] & 0xfffffff0) != 0xd0) {
      if (2 < (byte)(buf[1] + 0x39U)) goto LAB_0011c877;
      iVar2 = (1 << (buf[1] + 0x39U & 0x1f)) + 1;
    }
    _ok((uint)(iVar2 == 2),"mp_check_extl(data, d1) == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x1fc,"mp_check_extl(0x03U) == 0");
    switch(buf[1]) {
    case -0x39:
      uVar3 = (uint)(byte)buf[2];
      pcVar6 = buf + 3;
      break;
    case -0x38:
      uVar3 = (uint)(ushort)(CONCAT11(buf[3],buf[2]) << 8 | (ushort)(byte)buf[3]);
      pcVar6 = buf + 4;
      break;
    case -0x37:
      uVar1 = CONCAT12(buf[4],CONCAT11(buf[3],buf[2]));
      uVar3 = (uint)(byte)buf[5] | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 |
              CONCAT13(buf[5],uVar1) << 0x18;
      pcVar6 = buf + 6;
      break;
    default:
      goto switchD_00118840_caseD_ca;
    case -0x2c:
    case -0x2b:
    case -0x2a:
    case -0x29:
    case -0x28:
      uVar3 = 1 << (buf[1] + 0x2cU & 0x1f);
      pcVar6 = buf + 2;
    }
    _ok((uint)(uVar3 == 3),"mp_decode_extl(&d2 SCALAR(COMMA &ext_type)) == (0x03U)",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x1fc,"mp_decode(mp_encode(0x03U)) == 0x03U");
    _ok(1,"(d1 - data) == (3)",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x1fc,"len(mp_encode_extl(0x03U)");
    _ok((uint)(pcVar6 == buf + 3),"d1 == d2",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x1fc,"len(mp_decode_extl(0x03U))");
    _ok(1,"mp_sizeof_extl(0x03U) == 3",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x1fc,"mp_sizeof_extl(0x03U)");
    _ok((uint)(buf[3] == '\0' && CONCAT11(buf[2],buf[1]) == 0x3c7),
        "memcmp(data, (\"\\xc7\\x03\\x00\"), (3)) == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x1fc,"mp_encode(0x03U) == \"\\xc7\\x03\\x00\"");
    buf[2] = '\x05';
    buf[1] = -0x39;
    buf[3] = '\0';
    _space((FILE *)_stdout);
    fwrite("# ",2,1,_stdout);
    fwrite("extl 0x05U",10,1,_stdout);
    fputc(10,_stdout);
    if (mp_type_hint[(uint)(byte)buf[1]] != MP_EXT) goto LAB_0011c839;
    iVar2 = 1;
    if (((byte)buf[1] & 0xfffffff0) != 0xd0) {
      if (2 < (byte)(buf[1] + 0x39U)) goto LAB_0011c877;
      iVar2 = (1 << (buf[1] + 0x39U & 0x1f)) + 1;
    }
    _ok((uint)(iVar2 == 2),"mp_check_extl(data, d1) == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x1fd,"mp_check_extl(0x05U) == 0");
    switch(buf[1]) {
    case -0x39:
      uVar3 = (uint)(byte)buf[2];
      pcVar6 = buf + 3;
      break;
    case -0x38:
      uVar3 = (uint)(ushort)(CONCAT11(buf[3],buf[2]) << 8 | (ushort)(byte)buf[3]);
      pcVar6 = buf + 4;
      break;
    case -0x37:
      uVar1 = CONCAT12(buf[4],CONCAT11(buf[3],buf[2]));
      uVar3 = (uint)(byte)buf[5] | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 |
              CONCAT13(buf[5],uVar1) << 0x18;
      pcVar6 = buf + 6;
      break;
    default:
      goto switchD_00118840_caseD_ca;
    case -0x2c:
    case -0x2b:
    case -0x2a:
    case -0x29:
    case -0x28:
      uVar3 = 1 << (buf[1] + 0x2cU & 0x1f);
      pcVar6 = buf + 2;
    }
    _ok((uint)(uVar3 == 5),"mp_decode_extl(&d2 SCALAR(COMMA &ext_type)) == (0x05U)",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x1fd,"mp_decode(mp_encode(0x05U)) == 0x05U");
    _ok(1,"(d1 - data) == (3)",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x1fd,"len(mp_encode_extl(0x05U)");
    _ok((uint)(pcVar6 == buf + 3),"d1 == d2",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x1fd,"len(mp_decode_extl(0x05U))");
    _ok(1,"mp_sizeof_extl(0x05U) == 3",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x1fd,"mp_sizeof_extl(0x05U)");
    _ok((uint)(buf[3] == '\0' && CONCAT11(buf[2],buf[1]) == 0x5c7),
        "memcmp(data, (\"\\xc7\\x05\\x00\"), (3)) == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x1fd,"mp_encode(0x05U) == \"\\xc7\\x05\\x00\"");
    buf[2] = '\x06';
    buf[1] = -0x39;
    buf[3] = '\0';
    _space((FILE *)_stdout);
    fwrite("# ",2,1,_stdout);
    fwrite("extl 0x06U",10,1,_stdout);
    fputc(10,_stdout);
    if (mp_type_hint[(uint)(byte)buf[1]] != MP_EXT) goto LAB_0011c839;
    iVar2 = 1;
    if (((byte)buf[1] & 0xfffffff0) != 0xd0) {
      if (2 < (byte)(buf[1] + 0x39U)) goto LAB_0011c877;
      iVar2 = (1 << (buf[1] + 0x39U & 0x1f)) + 1;
    }
    _ok((uint)(iVar2 == 2),"mp_check_extl(data, d1) == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x1fe,"mp_check_extl(0x06U) == 0");
    switch(buf[1]) {
    case -0x39:
      uVar3 = (uint)(byte)buf[2];
      pcVar6 = buf + 3;
      break;
    case -0x38:
      uVar3 = (uint)(ushort)(CONCAT11(buf[3],buf[2]) << 8 | (ushort)(byte)buf[3]);
      pcVar6 = buf + 4;
      break;
    case -0x37:
      uVar1 = CONCAT12(buf[4],CONCAT11(buf[3],buf[2]));
      uVar3 = (uint)(byte)buf[5] | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 |
              CONCAT13(buf[5],uVar1) << 0x18;
      pcVar6 = buf + 6;
      break;
    default:
      goto switchD_00118840_caseD_ca;
    case -0x2c:
    case -0x2b:
    case -0x2a:
    case -0x29:
    case -0x28:
      uVar3 = 1 << (buf[1] + 0x2cU & 0x1f);
      pcVar6 = buf + 2;
    }
    _ok((uint)(uVar3 == 6),"mp_decode_extl(&d2 SCALAR(COMMA &ext_type)) == (0x06U)",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x1fe,"mp_decode(mp_encode(0x06U)) == 0x06U");
    _ok(1,"(d1 - data) == (3)",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x1fe,"len(mp_encode_extl(0x06U)");
    _ok((uint)(pcVar6 == buf + 3),"d1 == d2",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x1fe,"len(mp_decode_extl(0x06U))");
    _ok(1,"mp_sizeof_extl(0x06U) == 3",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x1fe,"mp_sizeof_extl(0x06U)");
    _ok((uint)(buf[3] == '\0' && CONCAT11(buf[2],buf[1]) == 0x6c7),
        "memcmp(data, (\"\\xc7\\x06\\x00\"), (3)) == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x1fe,"mp_encode(0x06U) == \"\\xc7\\x06\\x00\"");
    buf[2] = '\a';
    buf[1] = -0x39;
    buf[3] = '\0';
    _space((FILE *)_stdout);
    fwrite("# ",2,1,_stdout);
    fwrite("extl 0x07U",10,1,_stdout);
    fputc(10,_stdout);
    if (mp_type_hint[(uint)(byte)buf[1]] != MP_EXT) goto LAB_0011c839;
    iVar2 = 1;
    if (((byte)buf[1] & 0xfffffff0) != 0xd0) {
      if (2 < (byte)(buf[1] + 0x39U)) goto LAB_0011c877;
      iVar2 = (1 << (buf[1] + 0x39U & 0x1f)) + 1;
    }
    _ok((uint)(iVar2 == 2),"mp_check_extl(data, d1) == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x1ff,"mp_check_extl(0x07U) == 0");
    switch(buf[1]) {
    case -0x39:
      uVar3 = (uint)(byte)buf[2];
      pcVar6 = buf + 3;
      break;
    case -0x38:
      uVar3 = (uint)(ushort)(CONCAT11(buf[3],buf[2]) << 8 | (ushort)(byte)buf[3]);
      pcVar6 = buf + 4;
      break;
    case -0x37:
      uVar1 = CONCAT12(buf[4],CONCAT11(buf[3],buf[2]));
      uVar3 = (uint)(byte)buf[5] | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 |
              CONCAT13(buf[5],uVar1) << 0x18;
      pcVar6 = buf + 6;
      break;
    default:
      goto switchD_00118840_caseD_ca;
    case -0x2c:
    case -0x2b:
    case -0x2a:
    case -0x29:
    case -0x28:
      uVar3 = 1 << (buf[1] + 0x2cU & 0x1f);
      pcVar6 = buf + 2;
    }
    _ok((uint)(uVar3 == 7),"mp_decode_extl(&d2 SCALAR(COMMA &ext_type)) == (0x07U)",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x1ff,"mp_decode(mp_encode(0x07U)) == 0x07U");
    _ok(1,"(d1 - data) == (3)",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x1ff,"len(mp_encode_extl(0x07U)");
    _ok((uint)(pcVar6 == buf + 3),"d1 == d2",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x1ff,"len(mp_decode_extl(0x07U))");
    _ok(1,"mp_sizeof_extl(0x07U) == 3",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x1ff,"mp_sizeof_extl(0x07U)");
    _ok((uint)(buf[3] == '\0' && CONCAT11(buf[2],buf[1]) == 0x7c7),
        "memcmp(data, (\"\\xc7\\x07\\x00\"), (3)) == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x1ff,"mp_encode(0x07U) == \"\\xc7\\x07\\x00\"");
    buf[2] = '\t';
    buf[1] = -0x39;
    buf[3] = '\0';
    _space((FILE *)_stdout);
    fwrite("# ",2,1,_stdout);
    fwrite("extl 0x09U",10,1,_stdout);
    fputc(10,_stdout);
    if (mp_type_hint[(uint)(byte)buf[1]] != MP_EXT) goto LAB_0011c839;
    iVar2 = 1;
    if (((byte)buf[1] & 0xfffffff0) != 0xd0) {
      if (2 < (byte)(buf[1] + 0x39U)) goto LAB_0011c877;
      iVar2 = (1 << (buf[1] + 0x39U & 0x1f)) + 1;
    }
    _ok((uint)(iVar2 == 2),"mp_check_extl(data, d1) == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x200,"mp_check_extl(0x09U) == 0");
    switch(buf[1]) {
    case -0x39:
      uVar3 = (uint)(byte)buf[2];
      pcVar6 = buf + 3;
      break;
    case -0x38:
      uVar3 = (uint)(ushort)(CONCAT11(buf[3],buf[2]) << 8 | (ushort)(byte)buf[3]);
      pcVar6 = buf + 4;
      break;
    case -0x37:
      uVar1 = CONCAT12(buf[4],CONCAT11(buf[3],buf[2]));
      uVar3 = (uint)(byte)buf[5] | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 |
              CONCAT13(buf[5],uVar1) << 0x18;
      pcVar6 = buf + 6;
      break;
    default:
      goto switchD_00118840_caseD_ca;
    case -0x2c:
    case -0x2b:
    case -0x2a:
    case -0x29:
    case -0x28:
      uVar3 = 1 << (buf[1] + 0x2cU & 0x1f);
      pcVar6 = buf + 2;
    }
    _ok((uint)(uVar3 == 9),"mp_decode_extl(&d2 SCALAR(COMMA &ext_type)) == (0x09U)",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x200,"mp_decode(mp_encode(0x09U)) == 0x09U");
    _ok(1,"(d1 - data) == (3)",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x200,"len(mp_encode_extl(0x09U)");
    _ok((uint)(pcVar6 == buf + 3),"d1 == d2",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x200,"len(mp_decode_extl(0x09U))");
    _ok(1,"mp_sizeof_extl(0x09U) == 3",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x200,"mp_sizeof_extl(0x09U)");
    _ok((uint)(buf[3] == '\0' && CONCAT11(buf[2],buf[1]) == 0x9c7),
        "memcmp(data, (\"\\xc7\\x09\\x00\"), (3)) == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x200,"mp_encode(0x09U) == \"\\xc7\\x09\\x00\"");
    buf[2] = '\n';
    buf[1] = -0x39;
    buf[3] = '\0';
    _space((FILE *)_stdout);
    fwrite("# ",2,1,_stdout);
    fwrite("extl 0x0aU",10,1,_stdout);
    fputc(10,_stdout);
    if (mp_type_hint[(uint)(byte)buf[1]] != MP_EXT) goto LAB_0011c839;
    iVar2 = 1;
    if (((byte)buf[1] & 0xfffffff0) != 0xd0) {
      if (2 < (byte)(buf[1] + 0x39U)) goto LAB_0011c877;
      iVar2 = (1 << (buf[1] + 0x39U & 0x1f)) + 1;
    }
    _ok((uint)(iVar2 == 2),"mp_check_extl(data, d1) == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x201,"mp_check_extl(0x0aU) == 0");
    switch(buf[1]) {
    case -0x39:
      uVar3 = (uint)(byte)buf[2];
      pcVar6 = buf + 3;
      break;
    case -0x38:
      uVar3 = (uint)(ushort)(CONCAT11(buf[3],buf[2]) << 8 | (ushort)(byte)buf[3]);
      pcVar6 = buf + 4;
      break;
    case -0x37:
      uVar1 = CONCAT12(buf[4],CONCAT11(buf[3],buf[2]));
      uVar3 = (uint)(byte)buf[5] | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 |
              CONCAT13(buf[5],uVar1) << 0x18;
      pcVar6 = buf + 6;
      break;
    default:
      goto switchD_00118840_caseD_ca;
    case -0x2c:
    case -0x2b:
    case -0x2a:
    case -0x29:
    case -0x28:
      uVar3 = 1 << (buf[1] + 0x2cU & 0x1f);
      pcVar6 = buf + 2;
    }
    _ok((uint)(uVar3 == 10),"mp_decode_extl(&d2 SCALAR(COMMA &ext_type)) == (0x0aU)",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x201,"mp_decode(mp_encode(0x0aU)) == 0x0aU");
    _ok(1,"(d1 - data) == (3)",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x201,"len(mp_encode_extl(0x0aU)");
    _ok((uint)(pcVar6 == buf + 3),"d1 == d2",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x201,"len(mp_decode_extl(0x0aU))");
    _ok(1,"mp_sizeof_extl(0x0aU) == 3",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x201,"mp_sizeof_extl(0x0aU)");
    _ok((uint)(buf[3] == '\0' && CONCAT11(buf[2],buf[1]) == 0xac7),
        "memcmp(data, (\"\\xc7\\x0a\\x00\"), (3)) == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x201,"mp_encode(0x0aU) == \"\\xc7\\x0a\\x00\"");
    buf[2] = '\v';
    buf[1] = -0x39;
    buf[3] = '\0';
    _space((FILE *)_stdout);
    fwrite("# ",2,1,_stdout);
    fwrite("extl 0x0bU",10,1,_stdout);
    fputc(10,_stdout);
    if (mp_type_hint[(uint)(byte)buf[1]] != MP_EXT) goto LAB_0011c839;
    iVar2 = 1;
    if (((byte)buf[1] & 0xfffffff0) != 0xd0) {
      if (2 < (byte)(buf[1] + 0x39U)) goto LAB_0011c877;
      iVar2 = (1 << (buf[1] + 0x39U & 0x1f)) + 1;
    }
    _ok((uint)(iVar2 == 2),"mp_check_extl(data, d1) == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x202,"mp_check_extl(0x0bU) == 0");
    switch(buf[1]) {
    case -0x39:
      uVar3 = (uint)(byte)buf[2];
      pcVar6 = buf + 3;
      break;
    case -0x38:
      uVar3 = (uint)(ushort)(CONCAT11(buf[3],buf[2]) << 8 | (ushort)(byte)buf[3]);
      pcVar6 = buf + 4;
      break;
    case -0x37:
      uVar1 = CONCAT12(buf[4],CONCAT11(buf[3],buf[2]));
      uVar3 = (uint)(byte)buf[5] | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 |
              CONCAT13(buf[5],uVar1) << 0x18;
      pcVar6 = buf + 6;
      break;
    default:
      goto switchD_00118840_caseD_ca;
    case -0x2c:
    case -0x2b:
    case -0x2a:
    case -0x29:
    case -0x28:
      uVar3 = 1 << (buf[1] + 0x2cU & 0x1f);
      pcVar6 = buf + 2;
    }
    _ok((uint)(uVar3 == 0xb),"mp_decode_extl(&d2 SCALAR(COMMA &ext_type)) == (0x0bU)",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x202,"mp_decode(mp_encode(0x0bU)) == 0x0bU");
    _ok(1,"(d1 - data) == (3)",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x202,"len(mp_encode_extl(0x0bU)");
    _ok((uint)(pcVar6 == buf + 3),"d1 == d2",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x202,"len(mp_decode_extl(0x0bU))");
    _ok(1,"mp_sizeof_extl(0x0bU) == 3",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x202,"mp_sizeof_extl(0x0bU)");
    _ok((uint)(buf[3] == '\0' && CONCAT11(buf[2],buf[1]) == 0xbc7),
        "memcmp(data, (\"\\xc7\\x0b\\x00\"), (3)) == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x202,"mp_encode(0x0bU) == \"\\xc7\\x0b\\x00\"");
    buf[2] = '\f';
    buf[1] = -0x39;
    buf[3] = '\0';
    _space((FILE *)_stdout);
    fwrite("# ",2,1,_stdout);
    fwrite("extl 0x0cU",10,1,_stdout);
    fputc(10,_stdout);
    if (mp_type_hint[(uint)(byte)buf[1]] != MP_EXT) goto LAB_0011c839;
    iVar2 = 1;
    if (((byte)buf[1] & 0xfffffff0) != 0xd0) {
      if (2 < (byte)(buf[1] + 0x39U)) goto LAB_0011c877;
      iVar2 = (1 << (buf[1] + 0x39U & 0x1f)) + 1;
    }
    _ok((uint)(iVar2 == 2),"mp_check_extl(data, d1) == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x203,"mp_check_extl(0x0cU) == 0");
    switch(buf[1]) {
    case -0x39:
      uVar3 = (uint)(byte)buf[2];
      pcVar6 = buf + 3;
      break;
    case -0x38:
      uVar3 = (uint)(ushort)(CONCAT11(buf[3],buf[2]) << 8 | (ushort)(byte)buf[3]);
      pcVar6 = buf + 4;
      break;
    case -0x37:
      uVar1 = CONCAT12(buf[4],CONCAT11(buf[3],buf[2]));
      uVar3 = (uint)(byte)buf[5] | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 |
              CONCAT13(buf[5],uVar1) << 0x18;
      pcVar6 = buf + 6;
      break;
    default:
      goto switchD_00118840_caseD_ca;
    case -0x2c:
    case -0x2b:
    case -0x2a:
    case -0x29:
    case -0x28:
      uVar3 = 1 << (buf[1] + 0x2cU & 0x1f);
      pcVar6 = buf + 2;
    }
    _ok((uint)(uVar3 == 0xc),"mp_decode_extl(&d2 SCALAR(COMMA &ext_type)) == (0x0cU)",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x203,"mp_decode(mp_encode(0x0cU)) == 0x0cU");
    _ok(1,"(d1 - data) == (3)",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x203,"len(mp_encode_extl(0x0cU)");
    _ok((uint)(pcVar6 == buf + 3),"d1 == d2",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x203,"len(mp_decode_extl(0x0cU))");
    _ok(1,"mp_sizeof_extl(0x0cU) == 3",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x203,"mp_sizeof_extl(0x0cU)");
    _ok((uint)(buf[3] == '\0' && CONCAT11(buf[2],buf[1]) == 0xcc7),
        "memcmp(data, (\"\\xc7\\x0c\\x00\"), (3)) == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x203,"mp_encode(0x0cU) == \"\\xc7\\x0c\\x00\"");
    buf[2] = '\r';
    buf[1] = -0x39;
    buf[3] = '\0';
    _space((FILE *)_stdout);
    fwrite("# ",2,1,_stdout);
    fwrite("extl 0x0dU",10,1,_stdout);
    fputc(10,_stdout);
    if (mp_type_hint[(uint)(byte)buf[1]] != MP_EXT) goto LAB_0011c839;
    iVar2 = 1;
    if (((byte)buf[1] & 0xfffffff0) != 0xd0) {
      if (2 < (byte)(buf[1] + 0x39U)) goto LAB_0011c877;
      iVar2 = (1 << (buf[1] + 0x39U & 0x1f)) + 1;
    }
    _ok((uint)(iVar2 == 2),"mp_check_extl(data, d1) == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x204,"mp_check_extl(0x0dU) == 0");
    switch(buf[1]) {
    case -0x39:
      uVar3 = (uint)(byte)buf[2];
      pcVar6 = buf + 3;
      break;
    case -0x38:
      uVar3 = (uint)(ushort)(CONCAT11(buf[3],buf[2]) << 8 | (ushort)(byte)buf[3]);
      pcVar6 = buf + 4;
      break;
    case -0x37:
      uVar1 = CONCAT12(buf[4],CONCAT11(buf[3],buf[2]));
      uVar3 = (uint)(byte)buf[5] | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 |
              CONCAT13(buf[5],uVar1) << 0x18;
      pcVar6 = buf + 6;
      break;
    default:
      goto switchD_00118840_caseD_ca;
    case -0x2c:
    case -0x2b:
    case -0x2a:
    case -0x29:
    case -0x28:
      uVar3 = 1 << (buf[1] + 0x2cU & 0x1f);
      pcVar6 = buf + 2;
    }
    _ok((uint)(uVar3 == 0xd),"mp_decode_extl(&d2 SCALAR(COMMA &ext_type)) == (0x0dU)",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x204,"mp_decode(mp_encode(0x0dU)) == 0x0dU");
    _ok(1,"(d1 - data) == (3)",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x204,"len(mp_encode_extl(0x0dU)");
    _ok((uint)(pcVar6 == buf + 3),"d1 == d2",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x204,"len(mp_decode_extl(0x0dU))");
    _ok(1,"mp_sizeof_extl(0x0dU) == 3",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x204,"mp_sizeof_extl(0x0dU)");
    _ok((uint)(buf[3] == '\0' && CONCAT11(buf[2],buf[1]) == 0xdc7),
        "memcmp(data, (\"\\xc7\\x0d\\x00\"), (3)) == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x204,"mp_encode(0x0dU) == \"\\xc7\\x0d\\x00\"");
    buf[2] = '\x0e';
    buf[1] = -0x39;
    buf[3] = '\0';
    _space((FILE *)_stdout);
    fwrite("# ",2,1,_stdout);
    fwrite("extl 0x0eU",10,1,_stdout);
    fputc(10,_stdout);
    if (mp_type_hint[(uint)(byte)buf[1]] != MP_EXT) goto LAB_0011c839;
    iVar2 = 1;
    if (((byte)buf[1] & 0xfffffff0) != 0xd0) {
      if (2 < (byte)(buf[1] + 0x39U)) goto LAB_0011c877;
      iVar2 = (1 << (buf[1] + 0x39U & 0x1f)) + 1;
    }
    _ok((uint)(iVar2 == 2),"mp_check_extl(data, d1) == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x205,"mp_check_extl(0x0eU) == 0");
    switch(buf[1]) {
    case -0x39:
      uVar3 = (uint)(byte)buf[2];
      pcVar6 = buf + 3;
      break;
    case -0x38:
      uVar3 = (uint)(ushort)(CONCAT11(buf[3],buf[2]) << 8 | (ushort)(byte)buf[3]);
      pcVar6 = buf + 4;
      break;
    case -0x37:
      uVar1 = CONCAT12(buf[4],CONCAT11(buf[3],buf[2]));
      uVar3 = (uint)(byte)buf[5] | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 |
              CONCAT13(buf[5],uVar1) << 0x18;
      pcVar6 = buf + 6;
      break;
    default:
      goto switchD_00118840_caseD_ca;
    case -0x2c:
    case -0x2b:
    case -0x2a:
    case -0x29:
    case -0x28:
      uVar3 = 1 << (buf[1] + 0x2cU & 0x1f);
      pcVar6 = buf + 2;
    }
    _ok((uint)(uVar3 == 0xe),"mp_decode_extl(&d2 SCALAR(COMMA &ext_type)) == (0x0eU)",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x205,"mp_decode(mp_encode(0x0eU)) == 0x0eU");
    _ok(1,"(d1 - data) == (3)",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x205,"len(mp_encode_extl(0x0eU)");
    _ok((uint)(pcVar6 == buf + 3),"d1 == d2",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x205,"len(mp_decode_extl(0x0eU))");
    _ok(1,"mp_sizeof_extl(0x0eU) == 3",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x205,"mp_sizeof_extl(0x0eU)");
    _ok((uint)(buf[3] == '\0' && CONCAT11(buf[2],buf[1]) == 0xec7),
        "memcmp(data, (\"\\xc7\\x0e\\x00\"), (3)) == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x205,"mp_encode(0x0eU) == \"\\xc7\\x0e\\x00\"");
    buf[2] = '\x0f';
    buf[1] = -0x39;
    buf[3] = '\0';
    _space((FILE *)_stdout);
    fwrite("# ",2,1,_stdout);
    fwrite("extl 0x0fU",10,1,_stdout);
    fputc(10,_stdout);
    if (mp_type_hint[(uint)(byte)buf[1]] != MP_EXT) goto LAB_0011c839;
    iVar2 = 1;
    if (((byte)buf[1] & 0xfffffff0) != 0xd0) {
      if (2 < (byte)(buf[1] + 0x39U)) goto LAB_0011c877;
      iVar2 = (1 << (buf[1] + 0x39U & 0x1f)) + 1;
    }
    _ok((uint)(iVar2 == 2),"mp_check_extl(data, d1) == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x206,"mp_check_extl(0x0fU) == 0");
    switch(buf[1]) {
    case -0x39:
      uVar3 = (uint)(byte)buf[2];
      pcVar6 = buf + 3;
      break;
    case -0x38:
      uVar3 = (uint)(ushort)(CONCAT11(buf[3],buf[2]) << 8 | (ushort)(byte)buf[3]);
      pcVar6 = buf + 4;
      break;
    case -0x37:
      uVar1 = CONCAT12(buf[4],CONCAT11(buf[3],buf[2]));
      uVar3 = (uint)(byte)buf[5] | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 |
              CONCAT13(buf[5],uVar1) << 0x18;
      pcVar6 = buf + 6;
      break;
    default:
      goto switchD_00118840_caseD_ca;
    case -0x2c:
    case -0x2b:
    case -0x2a:
    case -0x29:
    case -0x28:
      uVar3 = 1 << (buf[1] + 0x2cU & 0x1f);
      pcVar6 = buf + 2;
    }
    uVar4 = 0;
    _ok((uint)(uVar3 == 0xf),"mp_decode_extl(&d2 SCALAR(COMMA &ext_type)) == (0x0fU)",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x206,"mp_decode(mp_encode(0x0fU)) == 0x0fU");
    _ok(1,"(d1 - data) == (3)",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x206,"len(mp_encode_extl(0x0fU)");
    _ok((uint)(pcVar6 == buf + 3),"d1 == d2",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x206,"len(mp_decode_extl(0x0fU))");
    _ok(1,"mp_sizeof_extl(0x0fU) == 3",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x206,"mp_sizeof_extl(0x0fU)");
    _ok((uint)(buf[3] == '\0' && CONCAT11(buf[2],buf[1]) == 0xfc7),
        "memcmp(data, (\"\\xc7\\x0f\\x00\"), (3)) == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x206,"mp_encode(0x0fU) == \"\\xc7\\x0f\\x00\"");
    buf[1] = -0x38;
    buf[2] = '\x01';
    buf[3] = '\0';
    buf[4] = '\0';
    _space((FILE *)_stdout);
    fwrite("# ",2,1,_stdout);
    fwrite("extl 0x0100U",0xc,1,_stdout);
    fputc(10,_stdout);
    if (mp_type_hint[(byte)buf[1]] != MP_EXT) goto LAB_0011c839;
    if ((buf[1] & 0xf0U) != 0xd0) {
      if (2 < (byte)(buf[1] + 0x39U)) goto LAB_0011c877;
      uVar4 = (uint)(buf[1] == -0x38);
    }
    _ok(uVar4,"mp_check_extl(data, d1) == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x209,"mp_check_extl(0x0100U) == 0");
    switch(buf[1]) {
    case -0x39:
      uVar3 = (uint)(byte)buf[2];
      pcVar6 = buf + 3;
      break;
    case -0x38:
      uVar3 = (uint)(ushort)(CONCAT11(buf[3],buf[2]) << 8 | (ushort)(byte)buf[3]);
      pcVar6 = buf + 4;
      break;
    case -0x37:
      uVar1 = CONCAT12(buf[4],CONCAT11(buf[3],buf[2]));
      uVar3 = (uint)(byte)buf[5] | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 |
              CONCAT13(buf[5],uVar1) << 0x18;
      pcVar6 = buf + 6;
      break;
    default:
      goto switchD_00118840_caseD_ca;
    case -0x2c:
    case -0x2b:
    case -0x2a:
    case -0x29:
    case -0x28:
      uVar3 = 1 << (buf[1] + 0x2cU & 0x1f);
      pcVar6 = buf + 2;
    }
    uVar4 = 0;
    _ok((uint)(uVar3 == 0x100),"mp_decode_extl(&d2 SCALAR(COMMA &ext_type)) == (0x0100U)",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x209,"mp_decode(mp_encode(0x0100U)) == 0x0100U");
    _ok(1,"(d1 - data) == (4)",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x209,"len(mp_encode_extl(0x0100U)");
    _ok((uint)(pcVar6 == buf + 4),"d1 == d2",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x209,"len(mp_decode_extl(0x0100U))");
    _ok(1,"mp_sizeof_extl(0x0100U) == 4",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x209,"mp_sizeof_extl(0x0100U)");
    _ok((uint)(CONCAT13(buf[4],CONCAT12(buf[3],CONCAT11(buf[2],buf[1]))) == 0x1c8),
        "memcmp(data, (\"\\xc8\\x01\\x00\\x00\"), (4)) == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x209,"mp_encode(0x0100U) == \"\\xc8\\x01\\x00\\x00\"");
    buf[1] = -0x38;
    buf[2] = '\x01';
    buf[3] = '\x01';
    buf[4] = '\0';
    _space((FILE *)_stdout);
    fwrite("# ",2,1,_stdout);
    fwrite("extl 0x0101U",0xc,1,_stdout);
    fputc(10,_stdout);
    if (mp_type_hint[(byte)buf[1]] != MP_EXT) goto LAB_0011c839;
    if ((buf[1] & 0xf0U) != 0xd0) {
      if (2 < (byte)(buf[1] + 0x39U)) goto LAB_0011c877;
      uVar4 = (uint)(buf[1] == -0x38);
    }
    _ok(uVar4,"mp_check_extl(data, d1) == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x20a,"mp_check_extl(0x0101U) == 0");
    switch(buf[1]) {
    case -0x39:
      uVar3 = (uint)(byte)buf[2];
      pcVar6 = buf + 3;
      break;
    case -0x38:
      uVar3 = (uint)(ushort)(CONCAT11(buf[3],buf[2]) << 8 | (ushort)(byte)buf[3]);
      pcVar6 = buf + 4;
      break;
    case -0x37:
      uVar1 = CONCAT12(buf[4],CONCAT11(buf[3],buf[2]));
      uVar3 = (uint)(byte)buf[5] | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 |
              CONCAT13(buf[5],uVar1) << 0x18;
      pcVar6 = buf + 6;
      break;
    default:
      goto switchD_00118840_caseD_ca;
    case -0x2c:
    case -0x2b:
    case -0x2a:
    case -0x29:
    case -0x28:
      uVar3 = 1 << (buf[1] + 0x2cU & 0x1f);
      pcVar6 = buf + 2;
    }
    uVar4 = 0;
    _ok((uint)(uVar3 == 0x101),"mp_decode_extl(&d2 SCALAR(COMMA &ext_type)) == (0x0101U)",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x20a,"mp_decode(mp_encode(0x0101U)) == 0x0101U");
    _ok(1,"(d1 - data) == (4)",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x20a,"len(mp_encode_extl(0x0101U)");
    _ok((uint)(pcVar6 == buf + 4),"d1 == d2",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x20a,"len(mp_decode_extl(0x0101U))");
    _ok(1,"mp_sizeof_extl(0x0101U) == 4",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x20a,"mp_sizeof_extl(0x0101U)");
    _ok((uint)(CONCAT13(buf[4],CONCAT12(buf[3],CONCAT11(buf[2],buf[1]))) == 0x101c8),
        "memcmp(data, (\"\\xc8\\x01\\x01\\x00\"), (4)) == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x20a,"mp_encode(0x0101U) == \"\\xc8\\x01\\x01\\x00\"");
    buf[1] = -0x38;
    buf[2] = -1;
    buf[3] = -2;
    buf[4] = '\0';
    _space((FILE *)_stdout);
    fwrite("# ",2,1,_stdout);
    fwrite("extl 0xfffeU",0xc,1,_stdout);
    fputc(10,_stdout);
    if (mp_type_hint[(byte)buf[1]] != MP_EXT) goto LAB_0011c839;
    if ((buf[1] & 0xf0U) != 0xd0) {
      if (2 < (byte)(buf[1] + 0x39U)) goto LAB_0011c877;
      uVar4 = (uint)(buf[1] == -0x38);
    }
    _ok(uVar4,"mp_check_extl(data, d1) == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x20b,"mp_check_extl(0xfffeU) == 0");
    switch(buf[1]) {
    case -0x39:
      uVar3 = (uint)(byte)buf[2];
      pcVar6 = buf + 3;
      break;
    case -0x38:
      uVar3 = (uint)(ushort)(CONCAT11(buf[3],buf[2]) << 8 | (ushort)(byte)buf[3]);
      pcVar6 = buf + 4;
      break;
    case -0x37:
      uVar1 = CONCAT12(buf[4],CONCAT11(buf[3],buf[2]));
      uVar3 = (uint)(byte)buf[5] | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 |
              CONCAT13(buf[5],uVar1) << 0x18;
      pcVar6 = buf + 6;
      break;
    default:
      goto switchD_00118840_caseD_ca;
    case -0x2c:
    case -0x2b:
    case -0x2a:
    case -0x29:
    case -0x28:
      uVar3 = 1 << (buf[1] + 0x2cU & 0x1f);
      pcVar6 = buf + 2;
    }
    uVar4 = 0;
    _ok((uint)(uVar3 == 0xfffe),"mp_decode_extl(&d2 SCALAR(COMMA &ext_type)) == (0xfffeU)",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x20b,"mp_decode(mp_encode(0xfffeU)) == 0xfffeU");
    _ok(1,"(d1 - data) == (4)",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x20b,"len(mp_encode_extl(0xfffeU)");
    _ok((uint)(pcVar6 == buf + 4),"d1 == d2",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x20b,"len(mp_decode_extl(0xfffeU))");
    _ok(1,"mp_sizeof_extl(0xfffeU) == 4",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x20b,"mp_sizeof_extl(0xfffeU)");
    _ok((uint)(CONCAT13(buf[4],CONCAT12(buf[3],CONCAT11(buf[2],buf[1]))) == 0xfeffc8),
        "memcmp(data, (\"\\xc8\\xff\\xfe\\x00\"), (4)) == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x20b,"mp_encode(0xfffeU) == \"\\xc8\\xff\\xfe\\x00\"");
    buf[1] = -0x38;
    buf[2] = -1;
    buf[3] = -1;
    buf[4] = '\0';
    _space((FILE *)_stdout);
    fwrite("# ",2,1,_stdout);
    fwrite("extl 0xffffU",0xc,1,_stdout);
    fputc(10,_stdout);
    if (mp_type_hint[(byte)buf[1]] != MP_EXT) goto LAB_0011c839;
    if ((buf[1] & 0xf0U) != 0xd0) {
      if (2 < (byte)(buf[1] + 0x39U)) goto LAB_0011c877;
      uVar4 = (uint)(buf[1] == -0x38);
    }
    _ok(uVar4,"mp_check_extl(data, d1) == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x20c,"mp_check_extl(0xffffU) == 0");
    switch(buf[1]) {
    case -0x39:
      uVar3 = (uint)(byte)buf[2];
      pcVar6 = buf + 3;
      break;
    case -0x38:
      uVar3 = (uint)(ushort)(CONCAT11(buf[3],buf[2]) << 8 | (ushort)(byte)buf[3]);
      pcVar6 = buf + 4;
      break;
    case -0x37:
      uVar1 = CONCAT12(buf[4],CONCAT11(buf[3],buf[2]));
      uVar3 = (uint)(byte)buf[5] | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 |
              CONCAT13(buf[5],uVar1) << 0x18;
      pcVar6 = buf + 6;
      break;
    default:
      goto switchD_00118840_caseD_ca;
    case -0x2c:
    case -0x2b:
    case -0x2a:
    case -0x29:
    case -0x28:
      uVar3 = 1 << (buf[1] + 0x2cU & 0x1f);
      pcVar6 = buf + 2;
    }
    uVar4 = 0;
    _ok((uint)(uVar3 == 0xffff),"mp_decode_extl(&d2 SCALAR(COMMA &ext_type)) == (0xffffU)",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x20c,"mp_decode(mp_encode(0xffffU)) == 0xffffU");
    _ok(1,"(d1 - data) == (4)",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x20c,"len(mp_encode_extl(0xffffU)");
    _ok((uint)(pcVar6 == buf + 4),"d1 == d2",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x20c,"len(mp_decode_extl(0xffffU))");
    _ok(1,"mp_sizeof_extl(0xffffU) == 4",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x20c,"mp_sizeof_extl(0xffffU)");
    _ok((uint)(CONCAT13(buf[4],CONCAT12(buf[3],CONCAT11(buf[2],buf[1]))) == 0xffffc8),
        "memcmp(data, (\"\\xc8\\xff\\xff\\x00\"), (4)) == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x20c,"mp_encode(0xffffU) == \"\\xc8\\xff\\xff\\x00\"");
    buf[1] = -0x37;
    buf[2] = '\0';
    buf[3] = '\x01';
    buf[4] = '\0';
    buf[5] = '\0';
    buf[6] = '\0';
    _space((FILE *)_stdout);
    fwrite("# ",2,1,_stdout);
    fwrite("extl 0x00010000U",0x10,1,_stdout);
    fputc(10,_stdout);
    if (mp_type_hint[(byte)buf[1]] != MP_EXT) goto LAB_0011c839;
    if ((buf[1] & 0xf0U) != 0xd0) {
      if (2 < (byte)(buf[1] + 0x39U)) goto LAB_0011c877;
      uVar4 = (uint)(buf[1] == -0x37);
    }
    _ok(uVar4,"mp_check_extl(data, d1) == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x20f,"mp_check_extl(0x00010000U) == 0");
    switch(buf[1]) {
    case -0x39:
      uVar3 = (uint)(byte)buf[2];
      pcVar6 = buf + 3;
      break;
    case -0x38:
      uVar3 = (uint)(ushort)(CONCAT11(buf[3],buf[2]) << 8 | (ushort)(byte)buf[3]);
      pcVar6 = buf + 4;
      break;
    case -0x37:
      uVar1 = CONCAT12(buf[4],CONCAT11(buf[3],buf[2]));
      uVar3 = (uint)(byte)buf[5] | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 |
              CONCAT13(buf[5],uVar1) << 0x18;
      pcVar6 = buf + 6;
      break;
    default:
      goto switchD_00118840_caseD_ca;
    case -0x2c:
    case -0x2b:
    case -0x2a:
    case -0x29:
    case -0x28:
      uVar3 = 1 << (buf[1] + 0x2cU & 0x1f);
      pcVar6 = buf + 2;
    }
    uVar4 = 0;
    _ok((uint)(uVar3 == 0x10000),"mp_decode_extl(&d2 SCALAR(COMMA &ext_type)) == (0x00010000U)",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x20f,"mp_decode(mp_encode(0x00010000U)) == 0x00010000U");
    _ok(1,"(d1 - data) == (6)",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x20f,"len(mp_encode_extl(0x00010000U)");
    _ok((uint)(pcVar6 == buf + 6),"d1 == d2",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x20f,"len(mp_decode_extl(0x00010000U))");
    _ok(1,"mp_sizeof_extl(0x00010000U) == 6",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x20f,"mp_sizeof_extl(0x00010000U)");
    _ok((uint)(CONCAT11(buf[6],buf[5]) == 0 &&
              CONCAT13(buf[4],CONCAT12(buf[3],CONCAT11(buf[2],buf[1]))) == 0x100c9),
        "memcmp(data, (\"\\xc9\\x00\\x01\\x00\\x00\\x00\"), (6)) == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x20f,"mp_encode(0x00010000U) == \"\\xc9\\x00\\x01\\x00\\x00\\x00\"");
    buf[1] = -0x37;
    buf[2] = '\0';
    buf[3] = '\x01';
    buf[4] = '\0';
    buf[5] = '\x01';
    buf[6] = '\0';
    _space((FILE *)_stdout);
    fwrite("# ",2,1,_stdout);
    fwrite("extl 0x00010001U",0x10,1,_stdout);
    fputc(10,_stdout);
    if (mp_type_hint[(byte)buf[1]] != MP_EXT) goto LAB_0011c839;
    if ((buf[1] & 0xf0U) != 0xd0) {
      if (2 < (byte)(buf[1] + 0x39U)) goto LAB_0011c877;
      uVar4 = (uint)(buf[1] == -0x37);
    }
    uVar3 = 0;
    _ok(uVar4,"mp_check_extl(data, d1) == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x210,"mp_check_extl(0x00010001U) == 0");
    switch(buf[1]) {
    case -0x39:
      pcVar6 = buf + 3;
      break;
    case -0x38:
      pcVar6 = buf + 4;
      break;
    case -0x37:
      uVar3 = (uint)(CONCAT13(buf[5],CONCAT12(buf[4],CONCAT11(buf[3],buf[2]))) == 0x1000100);
      pcVar6 = buf + 6;
      break;
    default:
      goto switchD_00118840_caseD_ca;
    case -0x2c:
    case -0x2b:
    case -0x2a:
    case -0x29:
    case -0x28:
      pcVar6 = buf + 2;
    }
    uVar4 = 0;
    _ok(uVar3,"mp_decode_extl(&d2 SCALAR(COMMA &ext_type)) == (0x00010001U)",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x210,"mp_decode(mp_encode(0x00010001U)) == 0x00010001U");
    _ok(1,"(d1 - data) == (6)",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x210,"len(mp_encode_extl(0x00010001U)");
    _ok((uint)(pcVar6 == buf + 6),"d1 == d2",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x210,"len(mp_decode_extl(0x00010001U))");
    _ok(1,"mp_sizeof_extl(0x00010001U) == 6",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x210,"mp_sizeof_extl(0x00010001U)");
    _ok((uint)(CONCAT11(buf[6],buf[5]) == 1 &&
              CONCAT13(buf[4],CONCAT12(buf[3],CONCAT11(buf[2],buf[1]))) == 0x100c9),
        "memcmp(data, (\"\\xc9\\x00\\x01\\x00\\x01\\x00\"), (6)) == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x210,"mp_encode(0x00010001U) == \"\\xc9\\x00\\x01\\x00\\x01\\x00\"");
    buf[1] = -0x37;
    buf[2] = -1;
    buf[3] = -1;
    buf[4] = -1;
    buf[5] = -2;
    buf[6] = '\0';
    _space((FILE *)_stdout);
    fwrite("# ",2,1,_stdout);
    fwrite("extl 0xfffffffeU",0x10,1,_stdout);
    fputc(10,_stdout);
    if (mp_type_hint[(byte)buf[1]] != MP_EXT) goto LAB_0011c839;
    if ((buf[1] & 0xf0U) != 0xd0) {
      if (2 < (byte)(buf[1] + 0x39U)) goto LAB_0011c877;
      uVar4 = (uint)(buf[1] == -0x37);
    }
    uVar3 = 0;
    _ok(uVar4,"mp_check_extl(data, d1) == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x211,"mp_check_extl(0xfffffffeU) == 0");
    switch(buf[1]) {
    case -0x39:
      pcVar6 = buf + 3;
      break;
    case -0x38:
      pcVar6 = buf + 4;
      break;
    case -0x37:
      uVar3 = (uint)(CONCAT13(buf[5],CONCAT12(buf[4],CONCAT11(buf[3],buf[2]))) == -0x1000001);
      pcVar6 = buf + 6;
      break;
    default:
      goto switchD_00118840_caseD_ca;
    case -0x2c:
    case -0x2b:
    case -0x2a:
    case -0x29:
    case -0x28:
      pcVar6 = buf + 2;
    }
    uVar4 = 0;
    _ok(uVar3,"mp_decode_extl(&d2 SCALAR(COMMA &ext_type)) == (0xfffffffeU)",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x211,"mp_decode(mp_encode(0xfffffffeU)) == 0xfffffffeU");
    _ok(1,"(d1 - data) == (6)",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x211,"len(mp_encode_extl(0xfffffffeU)");
    _ok((uint)(pcVar6 == buf + 6),"d1 == d2",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x211,"len(mp_decode_extl(0xfffffffeU))");
    _ok(1,"mp_sizeof_extl(0xfffffffeU) == 6",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x211,"mp_sizeof_extl(0xfffffffeU)");
    _ok((uint)(CONCAT11(buf[6],buf[5]) == 0xfe &&
              CONCAT13(buf[4],CONCAT12(buf[3],CONCAT11(buf[2],buf[1]))) == -0x37),
        "memcmp(data, (\"\\xc9\\xff\\xff\\xff\\xfe\\x00\"), (6)) == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x211,"mp_encode(0xfffffffeU) == \"\\xc9\\xff\\xff\\xff\\xfe\\x00\"");
    buf[1] = -0x37;
    buf[2] = -1;
    buf[3] = -1;
    buf[4] = -1;
    buf[5] = -1;
    buf[6] = '\0';
    _space((FILE *)_stdout);
    fwrite("# ",2,1,_stdout);
    fwrite("extl 0xffffffffU",0x10,1,_stdout);
    fputc(10,_stdout);
    if (mp_type_hint[(byte)buf[1]] == MP_EXT) {
      if ((buf[1] & 0xf0U) != 0xd0) {
        if (2 < (byte)(buf[1] + 0x39U)) {
LAB_0011c877:
          __assert_fail("c >= 0xc7 && c <= 0xc9",
                        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/../msgpuck.h"
                        ,0x84d,"ptrdiff_t mp_check_extl(const char *, const char *)");
        }
        uVar4 = (uint)(buf[1] == -0x37);
      }
      uVar3 = 0;
      _ok(uVar4,"mp_check_extl(data, d1) == 0",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
          0x212,"mp_check_extl(0xffffffffU) == 0");
      switch(buf[1]) {
      case -0x39:
        pcVar6 = buf + 3;
        break;
      case -0x38:
        pcVar6 = buf + 4;
        break;
      case -0x37:
        uVar3 = (uint)(CONCAT13(buf[5],CONCAT12(buf[4],CONCAT11(buf[3],buf[2]))) == -1);
        pcVar6 = buf + 6;
        break;
      default:
switchD_00118840_caseD_ca:
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/../msgpuck.h"
                      ,0x867,"uint32_t mp_decode_extl(const char **, int8_t *)");
      case -0x2c:
      case -0x2b:
      case -0x2a:
      case -0x29:
      case -0x28:
        pcVar6 = buf + 2;
      }
      _ok(uVar3,"mp_decode_extl(&d2 SCALAR(COMMA &ext_type)) == (0xffffffffU)",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
          0x212,"mp_decode(mp_encode(0xffffffffU)) == 0xffffffffU");
      _ok(1,"(d1 - data) == (6)",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
          0x212,"len(mp_encode_extl(0xffffffffU)");
      _ok((uint)(pcVar6 == buf + 6),"d1 == d2",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
          0x212,"len(mp_decode_extl(0xffffffffU))");
      _ok(1,"mp_sizeof_extl(0xffffffffU) == 6",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
          0x212,"mp_sizeof_extl(0xffffffffU)");
      _ok((uint)(CONCAT11(buf[6],buf[5]) == 0xff &&
                CONCAT13(buf[4],CONCAT12(buf[3],CONCAT11(buf[2],buf[1]))) == -0x37),
          "memcmp(data, (\"\\xc9\\xff\\xff\\xff\\xff\\x00\"), (6)) == 0",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
          0x212,"mp_encode(0xffffffffU) == \"\\xc9\\xff\\xff\\xff\\xff\\x00\"");
      _space((FILE *)_stdout);
      fwrite("# ",2,1,_stdout);
      fwrite("extl_safe",9,1,_stdout);
      fputc(10,_stdout);
      _ok(1,"-sz == (3)",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
          0x214,"size after mp_encode_extl_safe(NULL, &sz)");
      _ok(1,"d == NULL",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
          0x214,"mp_encode_extl_safe(NULL, &sz)");
      buf[2] = '\n';
      buf[1] = -0x39;
      buf[3] = '\0';
      _ok(1,"sz == 0",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
          0x214,"size after mp_encode_extl_safe(buf, &sz)");
      _ok(1,"(d - data) == (3)",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
          0x214,"len of mp_encode_extl_safe(buf, &sz)");
      _ok((uint)(buf[3] == '\0' && CONCAT11(buf[2],buf[1]) == 0xac7),
          "memcmp(data, (\"\\xc7\\x0a\\x00\"), (3)) == 0",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
          0x214,"mp_encode_extl_safe(buf, &sz)");
      _ok(1,"sz == -1",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
          0x214,"size after mp_encode_extl_safe(buf, &sz) overflow");
      _ok(1,"d == data",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
          0x214,"mp_encode_extl_safe(buf, &sz) overflow");
      buf[2] = '\n';
      buf[1] = -0x39;
      buf[3] = '\0';
      _ok(1,"(d - data) == (3)",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
          0x214,"len of mp_encode_extl_safe(buf, NULL)");
      _ok((uint)(buf[3] == '\0' && CONCAT11(buf[2],buf[1]) == 0xac7),
          "memcmp(data, (\"\\xc7\\x0a\\x00\"), (3)) == 0",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
          0x214,"mp_encode_extl_safe(buf, NULL)");
      _space((FILE *)_stdout);
      printf("# *** %s: done ***\n","test_extls");
      iVar2 = check_plan();
      return iVar2;
    }
  }
LAB_0011c839:
  __assert_fail("mp_typeof(*cur) == MP_EXT",
                "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/../msgpuck.h"
                ,0x847,"ptrdiff_t mp_check_extl(const char *, const char *)");
}

Assistant:

static int
test_extls(void)
{
	plan(28*6 + 9);
	header();

	/* fixext 1,2,4,8,16 */
	test_extl(0x01U, "\xd4\x00", 2);
	test_extl(0x02U, "\xd5\x00", 2);
	test_extl(0x04U, "\xd6\x00", 2);
	test_extl(0x08U, "\xd7\x00", 2);
	test_extl(0x10U, "\xd8\x00", 2);

	/* ext 8 */
	test_extl(0x11U, "\xc7\x11\x00", 3);
	test_extl(0xfeU, "\xc7\xfe\x00", 3);
	test_extl(0xffU, "\xc7\xff\x00", 3);

	test_extl(0x00U, "\xc7\x00\x00", 3);
	test_extl(0x03U, "\xc7\x03\x00", 3);
	test_extl(0x05U, "\xc7\x05\x00", 3);
	test_extl(0x06U, "\xc7\x06\x00", 3);
	test_extl(0x07U, "\xc7\x07\x00", 3);
	test_extl(0x09U, "\xc7\x09\x00", 3);
	test_extl(0x0aU, "\xc7\x0a\x00", 3);
	test_extl(0x0bU, "\xc7\x0b\x00", 3);
	test_extl(0x0cU, "\xc7\x0c\x00", 3);
	test_extl(0x0dU, "\xc7\x0d\x00", 3);
	test_extl(0x0eU, "\xc7\x0e\x00", 3);
	test_extl(0x0fU, "\xc7\x0f\x00", 3);

	/* ext 16 */
	test_extl(0x0100U, "\xc8\x01\x00\x00", 4);
	test_extl(0x0101U, "\xc8\x01\x01\x00", 4);
	test_extl(0xfffeU, "\xc8\xff\xfe\x00", 4);
	test_extl(0xffffU, "\xc8\xff\xff\x00", 4);

	/* ext 32 */
	test_extl(0x00010000U, "\xc9\x00\x01\x00\x00\x00", 6);
	test_extl(0x00010001U, "\xc9\x00\x01\x00\x01\x00", 6);
	test_extl(0xfffffffeU, "\xc9\xff\xff\xff\xfe\x00", 6);
	test_extl(0xffffffffU, "\xc9\xff\xff\xff\xff\x00", 6);

	test_extl_safe(0x0aU, "\xc7\x0a\x00", 3);

	footer();
	return check_plan();
}